

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::setTimeLevel(PeleLM *this,Real time,Real dt_old,Real dt_new)

{
  Real in_RDI;
  NavierStokesBase *in_XMM0_Qa;
  Real in_XMM1_Qa;
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *in_XMM2_Qa;
  
  NavierStokesBase::setTimeLevel(in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            (in_XMM2_Qa,(size_type)in_RDI);
  amrex::StateData::setTimeLevel((StateData *)in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            (in_XMM2_Qa,(size_type)in_RDI);
  amrex::StateData::setTimeLevel((StateData *)in_XMM0_Qa,in_XMM1_Qa,(Real)in_XMM2_Qa,in_RDI);
  return;
}

Assistant:

void
PeleLM::setTimeLevel (Real time,
                      Real dt_old,
                      Real dt_new)
{
   NavierStokesBase::setTimeLevel(time, dt_old, dt_new);

   state[RhoYdot_Type].setTimeLevel(time,dt_old,dt_new);

   state[FuncCount_Type].setTimeLevel(time,dt_old,dt_new);
}